

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_Constractor2_Test::TestBody(ConfidentialTxIn_Constractor2_Test *this)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  string local_2a0;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  string local_230;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_11;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1e8;
  ScriptWitness exp_witness_stack;
  ScriptWitness exp_pegin_witness;
  ConfidentialTxIn txin3;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin3,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  local_2a0._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin3.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetVout()","exp_index",(uint *)&local_2a0,&exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2a0._M_dataplus._M_p._0_4_ = cfd::core::AbstractTxIn::GetSequence(&txin3.super_AbstractTxIn)
  ;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetSequence()","exp_sequence",(uint *)&local_2a0,
             &exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxIn::GetTxid((Txid *)&local_2a0,&txin3.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)&local_2a0);
  pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_230,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar1,(char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_230._M_dataplus._M_p));
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&local_2a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)&gtest_ar,&txin3.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_(&local_2a0,(Script *)&gtest_ar);
  pcVar1 = (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p);
  cfd::core::Script::GetHex_abi_cxx11_(&local_230,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2a0);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,
             &txin3.blinding_nonce_.data_);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)&local_230);
  pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_2a0,&exp_blinding_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x61,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,
             &txin3.asset_entropy_.data_);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)&local_230);
  pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_2a0,&exp_asset_entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,99,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin3.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_2a0,(ConfidentialValue *)&gtest_ar);
  pcVar1 = (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_230,&exp_issuance_amount);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2a0);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x65,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin3.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_2a0,(ConfidentialValue *)&gtest_ar);
  pcVar1 = (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_230,&exp_inflation_keys);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_2a0);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x67,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,
             &txin3.issuance_amount_rangeproof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&local_230);
  pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2a0,&exp_issuance_amount_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,
             &txin3.inflation_keys_rangeproof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&local_230);
  pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2a0,&exp_inflation_keys_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint32_t)local_2a0._M_dataplus._M_p)
            );
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x6b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_2a0._M_dataplus._M_p._0_4_ =
       cfd::core::AbstractTxIn::GetScriptWitnessStackNum(&txin3.super_AbstractTxIn);
  local_230._M_dataplus._M_p._0_4_ = cfd::core::ScriptWitness::GetWitnessNum(&exp_witness_stack);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetScriptWitnessStackNum()",
             "exp_witness_stack.GetWitnessNum()",(uint *)&local_2a0,(uint *)&local_230);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x6d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxIn::GetScriptWitness((ScriptWitness *)&gtest_ar,&txin3.super_AbstractTxIn);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_230,
             (ScriptWitness *)&gtest_ar);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_2,
             &exp_witness_stack);
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)(local_230._M_string_length -
                      CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p
                              )) / 0x18) <= uVar3) break;
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&gtest_ar,
               (ByteData *)
               (CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint32_t)local_230._M_dataplus._M_p) +
               lVar2));
    pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    cfd::core::ByteData::GetHex_abi_cxx11_
              (&local_2a0,(ByteData *)(CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + lVar2));
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_11,"test_vector[idx].GetHex().c_str()",
               "exp_vector[idx].GetHex().c_str()",pcVar1,
               (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                (uint32_t)local_2a0._M_dataplus._M_p));
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_11.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar1 = "";
      if (gtest_ar_11.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x73,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_11.message_);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x18;
  }
  local_2a0._M_dataplus._M_p._0_4_ = cfd::core::ScriptWitness::GetWitnessNum(&txin3.pegin_witness_);
  gtest_ar_11._0_4_ = cfd::core::ScriptWitness::GetWitnessNum(&exp_pegin_witness);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum()",(uint *)&local_2a0,(uint *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x76,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptWitness::ScriptWitness((ScriptWitness *)&gtest_ar,&txin3.pegin_witness_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_11,
             (ScriptWitness *)&gtest_ar);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar);
  cfd::core::ScriptWitness::GetWitness(&local_1e8,&exp_pegin_witness);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_1e8.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e8.
                            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&gtest_ar,
               (ByteData *)(CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) + lVar2));
    pcVar1 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    cfd::core::ByteData::GetHex_abi_cxx11_
              (&local_2a0,
               (ByteData *)
               ((long)&((local_1e8.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_13,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar1,
               (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                (uint32_t)local_2a0._M_dataplus._M_p));
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_13.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar1 = "";
      if (gtest_ar_13.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x7c,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_13.message_);
    lVar2 = lVar2 + 0x18;
  }
  cfd::core::ConfidentialTxIn::GetWitnessHash((ByteData256 *)&local_2a0,&txin3);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)&local_2a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_13,"txin3.GetWitnessHash().GetHex().c_str()",
             "\"c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a0);
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_13.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_13.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1e8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_11);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_2);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_230);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin3);
  cfd::core::ScriptWitness::~ScriptWitness(&exp_pegin_witness);
  cfd::core::ScriptWitness::~ScriptWitness(&exp_witness_stack);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor2) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin3(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_EQ(txin3.GetVout(), exp_index);
  EXPECT_EQ(txin3.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin3.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin3.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txin3.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin3.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin3.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin3.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin3.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin3.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_EQ(txin3.GetScriptWitnessStackNum(),
      exp_witness_stack.GetWitnessNum());
  const std::vector<ByteData>& test_vector = txin3.GetScriptWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_vector = exp_witness_stack.GetWitness();
  for (size_t idx = 0; idx < test_vector.size(); ++idx) {
    EXPECT_STREQ(test_vector[idx].GetHex().c_str(),
        exp_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(txin3.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum());
  const std::vector<ByteData>& test_peg_vector = txin3.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_STREQ(txin3.GetWitnessHash().GetHex().c_str(),
    "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
}